

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

bool slang::ast::actuallyNeededCast(Type *type,Expression *operand)

{
  bool bVar1;
  ulong uVar2;
  
  do {
    while( true ) {
      uVar2 = (ulong)operand->kind;
      if (uVar2 < 0x29) break;
LAB_004d0785:
      if (operand->kind != 0xc) {
        return false;
      }
      bVar1 = Type::isEquivalent(type,(Type *)(((Expression *)((long)operand + 0x30))->syntax->
                                              super_SyntaxNode).parent);
      if (!bVar1) {
        return true;
      }
      bVar1 = Type::isEquivalent(type,*(Type **)((long)(((Expression *)((long)operand + 0x30))->
                                                       sourceRange).startLoc + 8));
      if (!bVar1) {
        return true;
      }
      bVar1 = actuallyNeededCast(type,(Expression *)((Expression *)((long)operand + 0x30))->syntax);
      if (bVar1) {
        return true;
      }
      operand = *(Expression **)&(((Expression *)((long)operand + 0x30))->sourceRange).startLoc;
    }
    if (uVar2 != 0x25) {
      if ((0x10e38000000U >> (uVar2 & 0x3f) & 1) != 0) {
        return true;
      }
      if (uVar2 == 0xf) {
        bVar1 = Type::isUnpackedArray(*(Type **)((long)operand + 8));
        return bVar1;
      }
      goto LAB_004d0785;
    }
    operand = *(Expression **)((long)operand + 0x30);
  } while( true );
}

Assistant:

static bool actuallyNeededCast(const Type& type, const Expression& operand) {
    // Check whether a cast was needed for the given operand to
    // reach the final type. This is true when the operand requires
    // an assignment-like context to determine its result.
    switch (operand.kind) {
        case ExpressionKind::NewArray:
        case ExpressionKind::NewClass:
        case ExpressionKind::NewCovergroup:
        case ExpressionKind::SimpleAssignmentPattern:
        case ExpressionKind::StructuredAssignmentPattern:
        case ExpressionKind::ReplicatedAssignmentPattern:
        case ExpressionKind::TaggedUnion:
            return true;
        case ExpressionKind::Concatenation:
            return operand.type->isUnpackedArray();
        case ExpressionKind::MinTypMax:
            return actuallyNeededCast(type, operand.as<MinTypMaxExpression>().selected());
        case ExpressionKind::ConditionalOp: {
            auto& cond = operand.as<ConditionalExpression>();
            if (!type.isEquivalent(*cond.left().type) || !type.isEquivalent(*cond.right().type))
                return true;
            return actuallyNeededCast(type, cond.left()) || actuallyNeededCast(type, cond.right());
        }
        default:
            return false;
    }
}